

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::FocusableItemRegister(ImGuiWindow *window,bool is_active,bool tab_stop)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  bool bVar3;
  int local_34;
  bool allow_keyboard_focus;
  ImGuiContext *g;
  bool tab_stop_local;
  bool is_active_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  bVar2 = (window->DC).AllowKeyboardFocus & 1;
  window->FocusIdxAllCounter = window->FocusIdxAllCounter + 1;
  if (bVar2 != 0) {
    window->FocusIdxTabCounter = window->FocusIdxTabCounter + 1;
  }
  if ((((tab_stop) && (window->FocusIdxAllRequestNext == 0x7fffffff)) &&
      (window->FocusIdxTabRequestNext == 0x7fffffff)) &&
     ((is_active && (bVar3 = IsKeyPressedMap(0,true), bVar3)))) {
    if (((pIVar1->IO).KeyShift & 1U) == 0) {
      local_34 = 1;
    }
    else {
      local_34 = 0;
      if (bVar2 != 0) {
        local_34 = -1;
      }
    }
    window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + local_34;
  }
  if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent) {
    window_local._7_1_ = true;
  }
  else if ((bVar2 == 0) || (window->FocusIdxTabCounter != window->FocusIdxTabRequestCurrent)) {
    window_local._7_1_ = false;
  }
  else {
    window_local._7_1_ = true;
  }
  return window_local._7_1_;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, bool is_active, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool allow_keyboard_focus = window->DC.AllowKeyboardFocus;
    window->FocusIdxAllCounter++;
    if (allow_keyboard_focus)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB, Shift-TAB switch focus
    // We can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && is_active && IsKeyPressedMap(ImGuiKey_Tab))
    {
        // Modulo on index will be applied at the end of frame once we've got the total counter of items.
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (allow_keyboard_focus ? -1 : 0) : +1);
    }

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;

    if (allow_keyboard_focus)
        if (window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
            return true;

    return false;
}